

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void skewness_double_suite::test_left_skew(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  close_to<double> predicate_09;
  close_to<double> predicate_10;
  double absolute_tolerance;
  double *in_stack_fffffffffffffde8;
  double local_208;
  value_type local_200;
  value_type local_1f8;
  double local_1e8;
  value_type local_1e0;
  value_type local_1d8;
  double local_1c8;
  value_type local_1c0;
  value_type local_1b8;
  double local_1a8;
  value_type local_1a0;
  value_type local_198;
  double local_188;
  value_type local_180;
  value_type local_178;
  double local_168;
  value_type local_160;
  value_type local_158;
  double local_148;
  value_type local_140;
  value_type local_138;
  double local_128;
  value_type local_120;
  value_type local_118;
  double local_108;
  value_type local_100;
  value_type local_f8;
  double local_e8;
  value_type local_e0;
  value_type local_d8;
  double local_c8;
  value_type local_c0;
  value_type local_b8;
  double local_a8;
  value_type local_a0 [4];
  undefined8 local_80;
  value_type local_78 [2];
  undefined8 local_68;
  value_type local_60 [2];
  undefined8 local_50;
  value_type local_48 [2];
  undefined1 local_38 [8];
  moment_skewness<double> filter;
  close_to<double> tolerance;
  
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)&filter.sum,1e-05,absolute_tolerance);
  trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::basic_moment
            ((basic_moment<double,_(trial::online::with)3> *)local_38);
  trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::push
            ((basic_moment<double,_(trial::online::with)3> *)local_38,1.0);
  local_48[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)1>::mean
                          ((basic_moment<double,_(trial::online::with)1> *)local_38);
  local_50 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x1d5,"void skewness_double_suite::test_left_skew()",local_48,&local_50);
  local_60[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)2>::variance
                          ((basic_moment<double,_(trial::online::with)2> *)local_38);
  local_68 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x1d6,"void skewness_double_suite::test_left_skew()",local_60,&local_68);
  local_78[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::skewness
                          ((basic_moment<double,_(trial::online::with)3> *)local_38);
  local_80 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.skewness()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x1d7,"void skewness_double_suite::test_left_skew()",local_78,&local_80);
  local_a0[2] = trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::
                unbiased_skewness((basic_moment<double,_(trial::online::with)3> *)local_38);
  local_a0[1] = 0.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.unbiased_skewness()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x1d8,"void skewness_double_suite::test_left_skew()",local_a0 + 2,local_a0 + 1);
  trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::push
            ((basic_moment<double,_(trial::online::with)3> *)local_38,2.0);
  local_a0[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)1>::mean
                          ((basic_moment<double,_(trial::online::with)1> *)local_38);
  local_a8 = 1.5;
  local_b8 = filter.sum.skewness;
  predicate_10.absolute = tolerance.relative;
  predicate_10.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x1da,0x113acb,(char *)local_a0,&local_a8,in_stack_fffffffffffffde8,
             predicate_10);
  local_c0 = trial::online::cumulative::basic_moment<double,_(trial::online::with)2>::variance
                       ((basic_moment<double,_(trial::online::with)2> *)local_38);
  local_c8 = 0.25;
  local_d8 = filter.sum.skewness;
  predicate_09.absolute = tolerance.relative;
  predicate_09.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.25","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x1db,0x113acb,(char *)&local_c0,&local_c8,in_stack_fffffffffffffde8,
             predicate_09);
  local_e0 = trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::skewness
                       ((basic_moment<double,_(trial::online::with)3> *)local_38);
  local_e8 = 0.0;
  local_f8 = filter.sum.skewness;
  predicate_08.absolute = tolerance.relative;
  predicate_08.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x1dc,0x113acb,(char *)&local_e0,&local_e8,in_stack_fffffffffffffde8,
             predicate_08);
  local_100 = trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::
              unbiased_skewness((basic_moment<double,_(trial::online::with)3> *)local_38);
  local_108 = 0.0;
  local_118 = filter.sum.skewness;
  predicate_07.absolute = tolerance.relative;
  predicate_07.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.unbiased_skewness()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x1dd,0x113acb,(char *)&local_100,&local_108,in_stack_fffffffffffffde8,
             predicate_07);
  trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::push
            ((basic_moment<double,_(trial::online::with)3> *)local_38,5.0);
  local_120 = trial::online::cumulative::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_38);
  local_128 = 2.66667;
  local_138 = filter.sum.skewness;
  predicate_06.absolute = tolerance.relative;
  predicate_06.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2.66667","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x1df,0x113acb,(char *)&local_120,&local_128,in_stack_fffffffffffffde8,
             predicate_06);
  local_140 = trial::online::cumulative::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_38);
  local_148 = 2.88889;
  local_158 = filter.sum.skewness;
  predicate_05.absolute = tolerance.relative;
  predicate_05.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","2.88889","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x1e0,0x113acb,(char *)&local_140,&local_148,in_stack_fffffffffffffde8,
             predicate_05);
  local_160 = trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_38);
  local_168 = 0.528;
  local_178 = filter.sum.skewness;
  predicate_04.absolute = tolerance.relative;
  predicate_04.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","0.52800","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x1e1,0x113acb,(char *)&local_160,&local_168,in_stack_fffffffffffffde8,
             predicate_04);
  local_180 = trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::
              unbiased_skewness((basic_moment<double,_(trial::online::with)3> *)local_38);
  local_188 = 1.29334;
  local_198 = filter.sum.skewness;
  predicate_03.absolute = tolerance.relative;
  predicate_03.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.unbiased_skewness()","1.29334","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x1e2,0x113acb,(char *)&local_180,&local_188,in_stack_fffffffffffffde8,
             predicate_03);
  trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::push
            ((basic_moment<double,_(trial::online::with)3> *)local_38,15.0);
  local_1a0 = trial::online::cumulative::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_38);
  local_1a8 = 5.75;
  local_1b8 = filter.sum.skewness;
  predicate_02.absolute = tolerance.relative;
  predicate_02.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.75","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x1e4,0x113acb,(char *)&local_1a0,&local_1a8,in_stack_fffffffffffffde8,
             predicate_02);
  local_1c0 = trial::online::cumulative::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_38);
  local_1c8 = 30.6875;
  local_1d8 = filter.sum.skewness;
  predicate_01.absolute = tolerance.relative;
  predicate_01.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","30.6875","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x1e5,0x113acb,(char *)&local_1c0,&local_1c8,in_stack_fffffffffffffde8,
             predicate_01);
  local_1e0 = trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_38);
  local_1e8 = 0.92814;
  local_1f8 = filter.sum.skewness;
  predicate_00.absolute = tolerance.relative;
  predicate_00.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","0.92814","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x1e6,0x113acb,(char *)&local_1e0,&local_1e8,in_stack_fffffffffffffde8,
             predicate_00);
  local_200 = trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::
              unbiased_skewness((basic_moment<double,_(trial::online::with)3> *)local_38);
  local_208 = 1.60758;
  predicate.absolute = tolerance.relative;
  predicate.relative = filter.sum.skewness;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.unbiased_skewness()","1.60758","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x1e7,0x113acb,(char *)&local_200,&local_208,(double *)filter.sum.skewness,
             predicate);
  return;
}

Assistant:

void test_left_skew()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    cumulative::moment_skewness<double> filter;
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.skewness(), 0.0);
    TRIAL_TEST_EQ(filter.unbiased_skewness(), 0.0);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.5, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.25, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 0.0, tolerance);
    TRIAL_TEST_WITH(filter.unbiased_skewness(), 0.0, tolerance);
    filter.push(5.0);
    TRIAL_TEST_WITH(filter.mean(), 2.66667, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 2.88889, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 0.52800, tolerance);
    TRIAL_TEST_WITH(filter.unbiased_skewness(), 1.29334, tolerance);
    filter.push(15.0);
    TRIAL_TEST_WITH(filter.mean(), 5.75, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 30.6875, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 0.92814, tolerance);
    TRIAL_TEST_WITH(filter.unbiased_skewness(), 1.60758, tolerance);
}